

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

vector<point,_std::allocator<point>_> *
filter_points(vector<point,_std::allocator<point>_> *__return_storage_ptr__,
             vector<point,_std::allocator<point>_> *input)

{
  pointer ppVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  vector<point,_std::allocator<point>_> *__range1;
  point *point;
  pointer this;
  undefined1 auVar6 [16];
  
  (__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar1 = (input->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (input->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
              super__Vector_impl_data._M_start; this != ppVar1; this = this + 1) {
    ::point::angle(this);
    ::point::angle(this);
    bVar2 = point_allowed(this);
    if (bVar2) {
      std::vector<point,_std::allocator<point>_>::push_back(__return_storage_ptr__,this);
    }
  }
  std::operator<<((ostream *)&std::cout,"Kept ");
  lVar4 = (long)(__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar5 = lVar4 >> 4;
  auVar6._8_4_ = (int)(lVar4 >> 0x24);
  auVar6._0_8_ = lVar5;
  auVar6._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     ((((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 100.0) /
                      (double)(ulong)((long)(input->
                                            super__Vector_base<point,_std::allocator<point>_>).
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)(input->
                                            super__Vector_base<point,_std::allocator<point>_>).
                                            _M_impl.super__Vector_impl_data._M_start >> 4));
  std::endl<char,std::char_traits<char>>(poVar3);
  return __return_storage_ptr__;
}

Assistant:

std::vector<point> filter_points(vector<point> &input) {
    vector<point> output;
    float min_angle = 0;
    float max_angle = 0;

    for(auto &point: input) {
        min_angle = min(min_angle, point.angle());
        max_angle = max(max_angle, point.angle());
        if(point_allowed(point)) {
            output.push_back(point);
        }
    }

    //cout << "Min angle is " << min_angle << endl;
    //cout << "Max angle is " << max_angle << endl;
    cout << "Kept " << (100.0 * output.size() / (float) input.size()) << endl;

    return output;
}